

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O2

void __thiscall
libsbox::BindRule::
BindRule<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (BindRule *this,Value *value)

{
  bool bVar1;
  int iVar2;
  ContextManager *pCVar3;
  Type pGVar4;
  allocator<char> local_41;
  string local_40 [32];
  
  (this->inside_)._M_dataplus._M_p = (pointer)&(this->inside_).field_2;
  (this->inside_)._M_string_length = 0;
  (this->inside_).field_2._M_local_buf[0] = '\0';
  (this->outside_)._M_dataplus._M_p = (pointer)&(this->outside_).field_2;
  (this->outside_)._M_string_length = 0;
  (this->outside_).field_2._M_local_buf[0] = '\0';
  if ((value->data_).f.flags != 3) {
    pCVar3 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"JSON is incorrect",&local_41);
    (**pCVar3->_vptr_ContextManager)(pCVar3,local_40);
    std::__cxx11::string::~string(local_40);
  }
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"inside");
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"JSON is incorrect",&local_41);
    (**pCVar3->_vptr_ContextManager)(pCVar3,local_40);
    std::__cxx11::string::~string(local_40);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"inside");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
    pCVar3 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"JSON is incorrect",&local_41);
    (**pCVar3->_vptr_ContextManager)(pCVar3,local_40);
    std::__cxx11::string::~string(local_40);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"inside");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetString(pGVar4);
  std::__cxx11::string::assign((char *)this);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"outside");
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"JSON is incorrect",&local_41);
    (**pCVar3->_vptr_ContextManager)(pCVar3,local_40);
    std::__cxx11::string::~string(local_40);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"outside");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
    pCVar3 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"JSON is incorrect",&local_41);
    (**pCVar3->_vptr_ContextManager)(pCVar3,local_40);
    std::__cxx11::string::~string(local_40);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"outside");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetString(pGVar4);
  std::__cxx11::string::assign((char *)&this->outside_);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"flags");
  if (!bVar1) {
    pCVar3 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"JSON is incorrect",&local_41);
    (**pCVar3->_vptr_ContextManager)(pCVar3,local_40);
    std::__cxx11::string::~string(local_40);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x20000000000000) ==
      (undefined1  [16])0x0) {
    pCVar3 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"JSON is incorrect",&local_41);
    (**pCVar3->_vptr_ContextManager)(pCVar3,local_40);
    std::__cxx11::string::~string(local_40);
  }
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"flags");
  iVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(pGVar4);
  this->flags_ = iVar2;
  return;
}

Assistant:

BindRule::BindRule(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(inside_, value, "inside", String);
    GET_MEMBER(outside_, value, "outside", String);
    GET_MEMBER(flags_, value, "flags", Int);
}